

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::DiscMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  undefined4 uVar11;
  RayHitK<4> *pRVar12;
  long lVar14;
  Scene *pSVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar23;
  float fVar24;
  undefined1 auVar21 [16];
  float fVar25;
  undefined1 auVar22 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  float fVar44;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  RayQueryContext *local_1b8;
  Scene *local_1b0;
  undefined8 *local_1a8;
  void *local_1a0;
  RTCRayQueryContext *local_198;
  RayHitK<4> *local_190;
  undefined1 (*local_188) [16];
  undefined4 local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [32];
  ulong uVar13;
  undefined1 auVar38 [64];
  
  pSVar15 = context->scene;
  pGVar5 = (pSVar15->geometries).items[Disc->sharedGeomID].ptr;
  lVar14 = *(long *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar17 = *(undefined1 (*) [16])(lVar14 + (Disc->primIDs).field_0.i[0] * _Var6);
  auVar41 = *(undefined1 (*) [16])(lVar14 + (Disc->primIDs).field_0.i[1] * _Var6);
  auVar35 = *(undefined1 (*) [16])(lVar14 + (Disc->primIDs).field_0.i[2] * _Var6);
  auVar34 = *(undefined1 (*) [16])(lVar14 + (Disc->primIDs).field_0.i[3] * _Var6);
  auVar19 = vunpcklps_avx(auVar17,auVar35);
  auVar22 = vunpckhps_avx(auVar17,auVar35);
  auVar17 = vunpcklps_avx(auVar41,auVar34);
  auVar42 = vunpckhps_avx(auVar41,auVar34);
  auVar34 = vunpcklps_avx(auVar19,auVar17);
  auVar41 = vunpckhps_avx(auVar19,auVar17);
  auVar36 = vunpcklps_avx(auVar22,auVar42);
  auVar17 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar35 = vpcmpgtd_avx(auVar17,_DAT_01ff0cf0);
  local_f8 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar11 = *(undefined4 *)(ray + k * 4);
  auVar21._4_4_ = uVar11;
  auVar21._0_4_ = uVar11;
  auVar21._8_4_ = uVar11;
  auVar21._12_4_ = uVar11;
  auVar34 = vsubps_avx(auVar34,auVar21);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar19._4_4_ = uVar11;
  auVar19._0_4_ = uVar11;
  auVar19._8_4_ = uVar11;
  auVar19._12_4_ = uVar11;
  auVar19 = vsubps_avx(auVar41,auVar19);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar17._4_4_ = uVar11;
  auVar17._0_4_ = uVar11;
  auVar17._8_4_ = uVar11;
  auVar17._12_4_ = uVar11;
  auVar36 = vsubps_avx(auVar36,auVar17);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar17 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar41 = vshufps_avx(auVar17,auVar17,0);
  auVar17 = vrcpps_avx(auVar41);
  fVar44 = auVar17._0_4_;
  auVar40._0_4_ = fVar44 * auVar41._0_4_;
  fVar49 = auVar17._4_4_;
  auVar40._4_4_ = fVar49 * auVar41._4_4_;
  fVar50 = auVar17._8_4_;
  auVar40._8_4_ = fVar50 * auVar41._8_4_;
  fVar51 = auVar17._12_4_;
  auVar40._12_4_ = fVar51 * auVar41._12_4_;
  auVar52._8_4_ = 0x3f800000;
  auVar52._0_8_ = &DAT_3f8000003f800000;
  auVar52._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar52,auVar40);
  fVar30 = auVar36._0_4_;
  fVar31 = auVar36._4_4_;
  fVar32 = auVar36._8_4_;
  fVar33 = auVar36._12_4_;
  fVar26 = auVar19._0_4_;
  fVar27 = auVar19._4_4_;
  fVar28 = auVar19._8_4_;
  fVar29 = auVar19._12_4_;
  fVar20 = auVar34._0_4_;
  fVar23 = auVar34._4_4_;
  fVar24 = auVar34._8_4_;
  fVar25 = auVar34._12_4_;
  local_138._0_4_ =
       (fVar20 * fVar1 + fVar26 * fVar2 + fVar30 * fVar3) * (fVar44 + fVar44 * auVar17._0_4_);
  local_138._4_4_ =
       (fVar23 * fVar1 + fVar27 * fVar2 + fVar31 * fVar3) * (fVar49 + fVar49 * auVar17._4_4_);
  local_138._8_4_ =
       (fVar24 * fVar1 + fVar28 * fVar2 + fVar32 * fVar3) * (fVar50 + fVar50 * auVar17._8_4_);
  local_138._12_4_ =
       (fVar25 * fVar1 + fVar29 * fVar2 + fVar33 * fVar3) * (fVar51 + fVar51 * auVar17._12_4_);
  auVar53 = ZEXT1664(local_138);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar41._4_4_ = uVar11;
  auVar41._0_4_ = uVar11;
  auVar41._8_4_ = uVar11;
  auVar41._12_4_ = uVar11;
  auVar17 = vcmpps_avx(auVar41,local_138,2);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar45._4_4_ = uVar11;
  auVar45._0_4_ = uVar11;
  auVar45._8_4_ = uVar11;
  auVar45._12_4_ = uVar11;
  auVar41 = vcmpps_avx(local_138,auVar45,2);
  auVar17 = vandps_avx(auVar41,auVar17);
  auVar41 = auVar35 & auVar17;
  if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar41[0xf] < '\0') {
    auVar17 = vandps_avx(auVar17,auVar35);
    auVar22 = vunpckhps_avx(auVar22,auVar42);
    auVar35._0_4_ = local_138._0_4_ * fVar1;
    auVar35._4_4_ = local_138._4_4_ * fVar1;
    auVar35._8_4_ = local_138._8_4_ * fVar1;
    auVar35._12_4_ = local_138._12_4_ * fVar1;
    auVar42._0_4_ = local_138._0_4_ * fVar2;
    auVar42._4_4_ = local_138._4_4_ * fVar2;
    auVar42._8_4_ = local_138._8_4_ * fVar2;
    auVar42._12_4_ = local_138._12_4_ * fVar2;
    auVar46._0_4_ = local_138._0_4_ * fVar3;
    auVar46._4_4_ = local_138._4_4_ * fVar3;
    auVar46._8_4_ = local_138._8_4_ * fVar3;
    auVar46._12_4_ = local_138._12_4_ * fVar3;
    auVar41 = vsubps_avx(auVar34,auVar35);
    auVar35 = vsubps_avx(auVar19,auVar42);
    auVar34 = vsubps_avx(auVar36,auVar46);
    auVar47._0_4_ = auVar34._0_4_ * auVar34._0_4_;
    auVar47._4_4_ = auVar34._4_4_ * auVar34._4_4_;
    auVar47._8_4_ = auVar34._8_4_ * auVar34._8_4_;
    auVar47._12_4_ = auVar34._12_4_ * auVar34._12_4_;
    auVar36._0_4_ = auVar35._0_4_ * auVar35._0_4_ + auVar47._0_4_ + auVar41._0_4_ * auVar41._0_4_;
    auVar36._4_4_ = auVar35._4_4_ * auVar35._4_4_ + auVar47._4_4_ + auVar41._4_4_ * auVar41._4_4_;
    auVar36._8_4_ = auVar35._8_4_ * auVar35._8_4_ + auVar47._8_4_ + auVar41._8_4_ * auVar41._8_4_;
    auVar36._12_4_ =
         auVar35._12_4_ * auVar35._12_4_ + auVar47._12_4_ + auVar41._12_4_ * auVar41._12_4_;
    auVar34._0_4_ = auVar22._0_4_ * auVar22._0_4_;
    auVar34._4_4_ = auVar22._4_4_ * auVar22._4_4_;
    auVar34._8_4_ = auVar22._8_4_ * auVar22._8_4_;
    auVar34._12_4_ = auVar22._12_4_ * auVar22._12_4_;
    auVar41 = vcmpps_avx(auVar36,auVar34,2);
    auVar35 = auVar17 & auVar41;
    if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0')
    {
      auVar17 = vandps_avx(auVar17,auVar41);
      auVar22._0_4_ = fVar20 * fVar20 + fVar26 * fVar26 + fVar30 * fVar30;
      auVar22._4_4_ = fVar23 * fVar23 + fVar27 * fVar27 + fVar31 * fVar31;
      auVar22._8_4_ = fVar24 * fVar24 + fVar28 * fVar28 + fVar32 * fVar32;
      auVar22._12_4_ = fVar25 * fVar25 + fVar29 * fVar29 + fVar33 * fVar33;
      auVar41 = vcmpps_avx(auVar22,auVar34,6);
      auVar35 = auVar41 & auVar17;
      if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0'
         ) {
        local_1d8 = vandps_avx(auVar17,auVar41);
        local_128._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
        local_128._8_4_ = -fVar1;
        local_128._12_4_ = -fVar1;
        local_158 = ZEXT832(0) << 0x20;
        local_118[0] = -fVar2;
        local_118[1] = -fVar2;
        local_118[2] = -fVar2;
        local_118[3] = -fVar2;
        local_108[0] = -fVar3;
        local_108[1] = -fVar3;
        local_108[2] = -fVar3;
        local_108[3] = -fVar3;
        auVar37._8_4_ = 0x7f800000;
        auVar37._0_8_ = 0x7f8000007f800000;
        auVar37._12_4_ = 0x7f800000;
        auVar38 = ZEXT1664(auVar37);
        auVar17 = vblendvps_avx(auVar37,local_138,local_1d8);
        auVar41 = vshufps_avx(auVar17,auVar17,0xb1);
        auVar41 = vminps_avx(auVar41,auVar17);
        auVar35 = vshufpd_avx(auVar41,auVar41,1);
        auVar41 = vminps_avx(auVar35,auVar41);
        auVar41 = vcmpps_avx(auVar17,auVar41,0);
        auVar35 = local_1d8 & auVar41;
        auVar17 = local_1d8;
        if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar35[0xf] < '\0') {
          auVar17 = vandps_avx(auVar41,local_1d8);
        }
        uVar10 = vmovmskps_avx(auVar17);
        lVar14 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        lVar16 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
        auVar7 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar39 = ZEXT3264(auVar7);
        auVar43 = ZEXT464(0) << 0x20;
        auVar17 = vpcmpeqd_avx(auVar47,auVar47);
        auVar48 = ZEXT1664(auVar17);
        auVar54 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
        do {
          local_188 = &local_e8;
          local_1a8 = &local_1c8;
          uVar10 = *(uint *)(local_f8 + lVar14 * 4);
          pRVar12 = (RayHitK<4> *)(ulong)uVar10;
          pGVar5 = (pSVar15->geometries).items[(long)pRVar12].ptr;
          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1d8 + lVar14 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar11 = *(undefined4 *)(local_158 + lVar14 * 4);
              uVar4 = *(undefined4 *)(local_158 + lVar14 * 4 + 0x10);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_138 + lVar14 * 4);
              *(float *)(ray + k * 4 + 0xc0) = local_118[lVar14 + -4];
              *(float *)(ray + k * 4 + 0xd0) = local_118[lVar14];
              *(float *)(ray + k * 4 + 0xe0) = local_108[lVar14];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar11;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
              *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar14];
              *(uint *)(ray + k * 4 + 0x120) = uVar10;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_b8 = *(undefined4 *)(local_158 + lVar14 * 4);
            local_a8 = *(undefined4 *)(local_158 + lVar14 * 4 + 0x10);
            local_88 = vpshufd_avx(ZEXT416(uVar10),0);
            local_98 = (Disc->primIDs).field_0.i[lVar14];
            fVar1 = local_118[lVar14 + -4];
            local_e8._4_4_ = fVar1;
            local_e8._0_4_ = fVar1;
            local_e8._8_4_ = fVar1;
            local_e8._12_4_ = fVar1;
            fVar1 = local_118[lVar14];
            local_d8._4_4_ = fVar1;
            local_d8._0_4_ = fVar1;
            local_d8._8_4_ = fVar1;
            local_d8._12_4_ = fVar1;
            fVar1 = local_108[lVar14];
            local_c8._4_4_ = fVar1;
            local_c8._0_4_ = fVar1;
            local_c8._8_4_ = fVar1;
            local_c8._12_4_ = fVar1;
            uStack_b4 = local_b8;
            uStack_b0 = local_b8;
            uStack_ac = local_b8;
            uStack_a4 = local_a8;
            uStack_a0 = local_a8;
            uStack_9c = local_a8;
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            uStack_74 = context->user->instID[0];
            local_78 = uStack_74;
            uStack_70 = uStack_74;
            uStack_6c = uStack_74;
            uStack_68 = context->user->instPrimID[0];
            uStack_64 = uStack_68;
            uStack_60 = uStack_68;
            uStack_5c = uStack_68;
            uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_138 + lVar14 * 4);
            local_1c8 = *(undefined8 *)(mm_lookupmask_ps + lVar16);
            uStack_1c0 = *(undefined8 *)(mm_lookupmask_ps + lVar16 + 8);
            local_1a0 = pGVar5->userPtr;
            local_198 = context->user;
            local_180 = 4;
            pRVar12 = (RayHitK<4> *)pGVar5->intersectionFilterN;
            local_168 = auVar53._0_16_;
            local_58 = auVar39._0_32_;
            local_178 = auVar54._0_16_;
            local_1b8 = context;
            local_190 = ray;
            if (pRVar12 != (RayHitK<4> *)0x0) {
              auVar17 = auVar48._0_16_;
              local_1b0 = pSVar15;
              pRVar12 = (RayHitK<4> *)(*(code *)pRVar12)(&local_1a8);
              auVar54 = ZEXT1664(local_178);
              auVar17 = vpcmpeqd_avx(auVar17,auVar17);
              auVar48 = ZEXT1664(auVar17);
              auVar43 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar39 = ZEXT3264(local_58);
              auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar53 = ZEXT1664(local_168);
              pSVar15 = local_1b0;
            }
            auVar8._8_8_ = uStack_1c0;
            auVar8._0_8_ = local_1c8;
            auVar17 = auVar48._0_16_;
            if (auVar8 == (undefined1  [16])0x0) {
              auVar41 = vpcmpeqd_avx(auVar43._0_16_,(undefined1  [16])0x0);
              auVar17 = auVar17 ^ auVar41;
              context = local_1b8;
            }
            else {
              pRVar12 = (RayHitK<4> *)local_1b8->args->filter;
              if ((pRVar12 != (RayHitK<4> *)0x0) &&
                 (((local_1b8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                pRVar12 = (RayHitK<4> *)(*(code *)pRVar12)();
                auVar54 = ZEXT1664(local_178);
                auVar17 = vpcmpeqd_avx(auVar17,auVar17);
                auVar48 = ZEXT1664(auVar17);
                auVar43 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar39 = ZEXT3264(local_58);
                auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar53 = ZEXT1664(local_168);
              }
              auVar9._8_8_ = uStack_1c0;
              auVar9._0_8_ = local_1c8;
              auVar41 = vpcmpeqd_avx(auVar43._0_16_,auVar9);
              auVar17 = auVar48._0_16_ ^ auVar41;
              context = local_1b8;
              if (auVar9 != (undefined1  [16])0x0) {
                auVar41 = auVar48._0_16_ ^ auVar41;
                auVar35 = vmaskmovps_avx(auVar41,*local_188);
                *(undefined1 (*) [16])(local_190 + 0xc0) = auVar35;
                auVar35 = vmaskmovps_avx(auVar41,local_188[1]);
                *(undefined1 (*) [16])(local_190 + 0xd0) = auVar35;
                auVar35 = vmaskmovps_avx(auVar41,local_188[2]);
                *(undefined1 (*) [16])(local_190 + 0xe0) = auVar35;
                auVar35 = vmaskmovps_avx(auVar41,local_188[3]);
                *(undefined1 (*) [16])(local_190 + 0xf0) = auVar35;
                auVar35 = vmaskmovps_avx(auVar41,local_188[4]);
                *(undefined1 (*) [16])(local_190 + 0x100) = auVar35;
                auVar35 = vmaskmovps_avx(auVar41,local_188[5]);
                *(undefined1 (*) [16])(local_190 + 0x110) = auVar35;
                auVar35 = vmaskmovps_avx(auVar41,local_188[6]);
                *(undefined1 (*) [16])(local_190 + 0x120) = auVar35;
                auVar35 = vmaskmovps_avx(auVar41,local_188[7]);
                *(undefined1 (*) [16])(local_190 + 0x130) = auVar35;
                auVar41 = vmaskmovps_avx(auVar41,local_188[8]);
                *(undefined1 (*) [16])(local_190 + 0x140) = auVar41;
                pRVar12 = local_190;
              }
            }
            if ((auVar54._0_16_ & auVar17) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar11;
            }
            *(undefined4 *)(local_1d8 + lVar14 * 4) = 0;
            uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar18._4_4_ = uVar11;
            auVar18._0_4_ = uVar11;
            auVar18._8_4_ = uVar11;
            auVar18._12_4_ = uVar11;
            auVar17 = vcmpps_avx(auVar53._0_16_,auVar18,2);
            local_1d8 = vandps_avx(auVar17,local_1d8);
          }
          if ((((local_1d8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_1d8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_1d8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_1d8[0xf]) {
            return;
          }
          auVar17 = vblendvps_avx(auVar38._0_16_,auVar53._0_16_,local_1d8);
          auVar41 = vshufps_avx(auVar17,auVar17,0xb1);
          auVar41 = vminps_avx(auVar41,auVar17);
          auVar35 = vshufpd_avx(auVar41,auVar41,1);
          auVar41 = vminps_avx(auVar35,auVar41);
          auVar41 = vcmpps_avx(auVar17,auVar41,0);
          auVar35 = local_1d8 & auVar41;
          auVar17 = local_1d8;
          if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar35[0xf] < '\0') {
            auVar17 = vandps_avx(auVar41,local_1d8);
          }
          uVar11 = vmovmskps_avx(auVar17);
          uVar13 = CONCAT44((int)((ulong)pRVar12 >> 0x20),uVar11);
          lVar14 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }